

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

int __thiscall libwebvtt::Parser::Parse(Parser *this,Cue *cue)

{
  int iVar1;
  size_type arrow_pos;
  payload_t *this_00;
  bool bVar2;
  char kArrow [4];
  string line;
  
  if (cue == (Cue *)0x0) {
    return -1;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    iVar1 = LineReader::GetLine(&this->super_LineReader,&line);
    if (iVar1 != 0) goto LAB_00119bb5;
  } while (line._M_string_length == 0);
  builtin_strncpy(kArrow,"-->",4);
  arrow_pos = std::__cxx11::string::find((char *)&line,(ulong)kArrow);
  if (arrow_pos == 0xffffffffffffffff) {
    std::__cxx11::string::swap((string *)cue);
    iVar1 = LineReader::GetLine(&this->super_LineReader,&line);
    bVar2 = iVar1 != 0;
    if (((iVar1 < 0) || (iVar1 = -1, bVar2)) ||
       (arrow_pos = std::__cxx11::string::find((char *)&line,(ulong)kArrow),
       arrow_pos == 0xffffffffffffffff)) goto LAB_00119bb5;
  }
  else {
    (cue->identifier)._M_string_length = 0;
    *(cue->identifier)._M_dataplus._M_p = '\0';
  }
  iVar1 = ParseTimingsLine(&line,arrow_pos,&cue->start_time,&cue->stop_time,&cue->settings);
  if (iVar1 == 0) {
    this_00 = &cue->payload;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    while (iVar1 = LineReader::GetLine(&this->super_LineReader,&line), -1 < iVar1) {
      if (line._M_string_length == 0) {
        iVar1 = -(uint)((this_00->
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)this_00);
        break;
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&line);
    }
  }
LAB_00119bb5:
  std::__cxx11::string::~string((string *)&line);
  return iVar1;
}

Assistant:

int Parser::Parse(Cue* cue) {
  if (cue == NULL)
    return -1;

  // Parse first non-blank line

  std::string line;
  int e;

  for (;;) {
    e = GetLine(&line);

    if (e)  // EOF is OK here
      return e;

    if (!line.empty())
      break;
  }

  // A WebVTT cue comprises an optional cue identifier line followed
  // by a (non-optional) timings line.  You determine whether you have
  // a timings line by scanning for the arrow token, the lexeme of which
  // may not appear in the cue identifier line.

  const char kArrow[] = "-->";
  std::string::size_type arrow_pos = line.find(kArrow);

  if (arrow_pos != std::string::npos) {
    // We found a timings line, which implies that we don't have a cue
    // identifier.

    cue->identifier.clear();
  } else {
    // We did not find a timings line, so we assume that we have a cue
    // identifier line, and then try again to find the cue timings on
    // the next line.

    cue->identifier.swap(line);

    e = GetLine(&line);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    arrow_pos = line.find(kArrow);

    if (arrow_pos == std::string::npos)  // not a timings line
      return -1;
  }

  e = ParseTimingsLine(&line, arrow_pos, &cue->start_time, &cue->stop_time,
                       &cue->settings);

  if (e)  // error
    return e;

  // The cue payload comprises all the non-empty
  // lines that follow the timings line.

  Cue::payload_t& p = cue->payload;
  p.clear();

  for (;;) {
    e = GetLine(&line);

    if (e < 0)  // error
      return e;

    if (line.empty())
      break;

    p.push_back(line);
  }

  if (p.empty())
    return -1;

  return 0;  // success
}